

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

bool fasttext::utils::containsSecond<float,int>
               (vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *container,
               int *value)

{
  bool bVar1;
  const_iterator __rhs;
  __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  in_RSI;
  __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  in_RDI;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_stack_ffffffffffffffc8;
  anon_class_8_1_a8c68091_for__M_pred in_stack_ffffffffffffffe8;
  
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
            (in_stack_ffffffffffffffc8);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
            (in_stack_ffffffffffffffc8);
  std::
  find_if<__gnu_cxx::__normal_iterator<std::pair<float,int>const*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,fasttext::utils::containsSecond<float,int>(std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>const&,int_const&)::_lambda(std::pair<float,int>const&)_1_>
            (in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  __rhs = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                    (in_stack_ffffffffffffffc8);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                      *)in_RSI._M_current,
                     (__normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                      *)__rhs._M_current);
  return bVar1;
}

Assistant:

bool containsSecond(
    const std::vector<std::pair<T1, T2>>& container,
    const T2& value) {
  return std::find_if(
             container.begin(),
             container.end(),
             [&value](const std::pair<T1, T2>& item) {
               return item.second == value;
             }) != container.end();
}